

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O1

void __thiscall
Assimp::PretransformVertices::BuildWCSMeshes
          (PretransformVertices *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *out,aiMesh **in,
          uint numIn,aiNode *node)

{
  aiMatrix4x4 *paVar1;
  float *pfVar2;
  pointer *pppaVar3;
  aiMesh *src;
  aiBone **ppaVar4;
  iterator __position;
  PretransformVertices *this_00;
  uint uVar5;
  Logger *this_01;
  ulong uVar6;
  pointer ppaVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  aiMesh *ntz;
  aiMesh *local_58;
  int local_50;
  uint local_4c;
  PretransformVertices *local_48;
  ulong local_40;
  aiMesh **local_38;
  
  uVar10 = (ulong)numIn;
  local_48 = this;
  if (node->mNumMeshes != 0) {
    paVar1 = &node->mTransformation;
    local_50 = numIn - 1;
    uVar9 = 0;
    local_40 = uVar10;
    local_38 = in;
    do {
      src = local_38[node->mMeshes[uVar9]];
      ppaVar4 = src->mBones;
      if ((ppaVar4 == (aiBone **)0x0) ||
         (((((((((*(float *)ppaVar4 == paVar1->a1 && (!NAN(*(float *)ppaVar4) && !NAN(paVar1->a1)))
                && (pfVar2 = &(node->mTransformation).a2, *(float *)((long)ppaVar4 + 4) == *pfVar2))
               && ((!NAN(*(float *)((long)ppaVar4 + 4)) && !NAN(*pfVar2) &&
                   (pfVar2 = &(node->mTransformation).a3, *(float *)(ppaVar4 + 1) == *pfVar2)))) &&
              ((!NAN(*(float *)(ppaVar4 + 1)) && !NAN(*pfVar2) &&
               ((pfVar2 = &(node->mTransformation).a4, *(float *)((long)ppaVar4 + 0xc) == *pfVar2 &&
                (!NAN(*(float *)((long)ppaVar4 + 0xc)) && !NAN(*pfVar2))))))) &&
             ((pfVar2 = &(node->mTransformation).b1, *(float *)(ppaVar4 + 2) == *pfVar2 &&
              ((((!NAN(*(float *)(ppaVar4 + 2)) && !NAN(*pfVar2) &&
                 (pfVar2 = &(node->mTransformation).b2, *(float *)((long)ppaVar4 + 0x14) == *pfVar2)
                 ) && (!NAN(*(float *)((long)ppaVar4 + 0x14)) && !NAN(*pfVar2))) &&
               (((pfVar2 = &(node->mTransformation).b3, *(float *)(ppaVar4 + 3) == *pfVar2 &&
                 (!NAN(*(float *)(ppaVar4 + 3)) && !NAN(*pfVar2))) &&
                ((pfVar2 = &(node->mTransformation).b4, *(float *)((long)ppaVar4 + 0x1c) == *pfVar2
                 && ((!NAN(*(float *)((long)ppaVar4 + 0x1c)) && !NAN(*pfVar2) &&
                     (pfVar2 = &(node->mTransformation).c1, *(float *)(ppaVar4 + 4) == *pfVar2))))))
               )))))) && (!NAN(*(float *)(ppaVar4 + 4)) && !NAN(*pfVar2))) &&
           (((pfVar2 = &(node->mTransformation).c2, *(float *)((long)ppaVar4 + 0x24) == *pfVar2 &&
             (!NAN(*(float *)((long)ppaVar4 + 0x24)) && !NAN(*pfVar2))) &&
            (pfVar2 = &(node->mTransformation).c3, *(float *)(ppaVar4 + 5) == *pfVar2)))) &&
          (((!NAN(*(float *)(ppaVar4 + 5)) && !NAN(*pfVar2) &&
            (pfVar2 = &(node->mTransformation).c4, *(float *)((long)ppaVar4 + 0x2c) == *pfVar2)) &&
           ((((!NAN(*(float *)((long)ppaVar4 + 0x2c)) && !NAN(*pfVar2) &&
              ((pfVar2 = &(node->mTransformation).d1, *(float *)(ppaVar4 + 6) == *pfVar2 &&
               (!NAN(*(float *)(ppaVar4 + 6)) && !NAN(*pfVar2))))) &&
             (pfVar2 = &(node->mTransformation).d2, *(float *)((long)ppaVar4 + 0x34) == *pfVar2)) &&
            ((((!NAN(*(float *)((long)ppaVar4 + 0x34)) && !NAN(*pfVar2) &&
               (pfVar2 = &(node->mTransformation).d3, *(float *)(ppaVar4 + 7) == *pfVar2)) &&
              (!NAN(*(float *)(ppaVar4 + 7)) && !NAN(*pfVar2))) &&
             ((pfVar2 = &(node->mTransformation).d4, *(float *)((long)ppaVar4 + 0x3c) == *pfVar2 &&
              (!NAN(*(float *)((long)ppaVar4 + 0x3c)) && !NAN(*pfVar2))))))))))))) {
        src->mBones = (aiBone **)paVar1;
        src->mNumBones = 0xffffffff;
      }
      else {
        ppaVar7 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish != ppaVar7) {
          uVar5 = 1;
          uVar6 = uVar10 & 0xffffffff;
          uVar8 = 0;
          do {
            if (ppaVar7[uVar8]->mNumBones == node->mMeshes[uVar9]) {
              ppaVar4 = ppaVar7[uVar8]->mBones;
              if (((((*(float *)ppaVar4 == paVar1->a1) &&
                    (!NAN(*(float *)ppaVar4) && !NAN(paVar1->a1))) &&
                   ((pfVar2 = &(node->mTransformation).a2, *(float *)((long)ppaVar4 + 4) == *pfVar2
                    && (((!NAN(*(float *)((long)ppaVar4 + 4)) && !NAN(*pfVar2) &&
                         (pfVar2 = &(node->mTransformation).a3, *(float *)(ppaVar4 + 1) == *pfVar2))
                        && (!NAN(*(float *)(ppaVar4 + 1)) && !NAN(*pfVar2))))))) &&
                  (((pfVar2 = &(node->mTransformation).a4,
                    *(float *)((long)ppaVar4 + 0xc) == *pfVar2 &&
                    (!NAN(*(float *)((long)ppaVar4 + 0xc)) && !NAN(*pfVar2))) &&
                   (((pfVar2 = &(node->mTransformation).b1, *(float *)(ppaVar4 + 2) == *pfVar2 &&
                     (((!NAN(*(float *)(ppaVar4 + 2)) && !NAN(*pfVar2) &&
                       (pfVar2 = &(node->mTransformation).b2,
                       *(float *)((long)ppaVar4 + 0x14) == *pfVar2)) &&
                      ((!NAN(*(float *)((long)ppaVar4 + 0x14)) && !NAN(*pfVar2) &&
                       (((pfVar2 = &(node->mTransformation).b3, *(float *)(ppaVar4 + 3) == *pfVar2
                         && (!NAN(*(float *)(ppaVar4 + 3)) && !NAN(*pfVar2))) &&
                        (pfVar2 = &(node->mTransformation).b4,
                        *(float *)((long)ppaVar4 + 0x1c) == *pfVar2)))))))) &&
                    (((!NAN(*(float *)((long)ppaVar4 + 0x1c)) && !NAN(*pfVar2) &&
                      (pfVar2 = &(node->mTransformation).c1, *(float *)(ppaVar4 + 4) == *pfVar2)) &&
                     (!NAN(*(float *)(ppaVar4 + 4)) && !NAN(*pfVar2))))))))) &&
                 (((((pfVar2 = &(node->mTransformation).c2,
                     *(float *)((long)ppaVar4 + 0x24) == *pfVar2 &&
                     (!NAN(*(float *)((long)ppaVar4 + 0x24)) && !NAN(*pfVar2))) &&
                    ((pfVar2 = &(node->mTransformation).c3, *(float *)(ppaVar4 + 5) == *pfVar2 &&
                     (((((!NAN(*(float *)(ppaVar4 + 5)) && !NAN(*pfVar2) &&
                         (pfVar2 = &(node->mTransformation).c4,
                         *(float *)((long)ppaVar4 + 0x2c) == *pfVar2)) &&
                        (!NAN(*(float *)((long)ppaVar4 + 0x2c)) && !NAN(*pfVar2))) &&
                       ((pfVar2 = &(node->mTransformation).d1, *(float *)(ppaVar4 + 6) == *pfVar2 &&
                        (!NAN(*(float *)(ppaVar4 + 6)) && !NAN(*pfVar2))))) &&
                      (pfVar2 = &(node->mTransformation).d2,
                      *(float *)((long)ppaVar4 + 0x34) == *pfVar2)))))) &&
                   ((!NAN(*(float *)((long)ppaVar4 + 0x34)) && !NAN(*pfVar2) &&
                    (pfVar2 = &(node->mTransformation).d3, *(float *)(ppaVar4 + 7) == *pfVar2)))) &&
                  ((!NAN(*(float *)(ppaVar4 + 7)) && !NAN(*pfVar2) &&
                   ((pfVar2 = &(node->mTransformation).d4,
                    *(float *)((long)ppaVar4 + 0x3c) == *pfVar2 &&
                    (!NAN(*(float *)((long)ppaVar4 + 0x3c)) && !NAN(*pfVar2))))))))) {
                node->mMeshes[uVar9] = (uint)uVar6;
              }
            }
            uVar8 = (ulong)uVar5;
            ppaVar7 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            uVar6 = (ulong)((uint)uVar6 + 1);
            uVar5 = uVar5 + 1;
          } while (uVar8 < (ulong)((long)(out->
                                         super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar7
                                  >> 3));
        }
        if (node->mMeshes[uVar9] < (uint)uVar10) {
          this_01 = DefaultLogger::get();
          Logger::info(this_01,"PretransformVertices: Copying mesh due to mismatching transforms");
          local_4c = src->mNumBones;
          src->mNumBones = 0;
          SceneCombiner::Copy(&local_58,src);
          src->mNumBones = local_4c;
          local_58->mNumBones = node->mMeshes[uVar9];
          local_58->mBones = (aiBone **)paVar1;
          __position._M_current =
               (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)out,__position,&local_58);
          }
          else {
            *__position._M_current = local_58;
            pppaVar3 = &(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppaVar3 = *pppaVar3 + 1;
          }
          node->mMeshes[uVar9] =
               (int)((ulong)((long)(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) + local_50;
          uVar10 = local_40;
        }
      }
      numIn = (uint)uVar10;
      uVar9 = uVar9 + 1;
      in = local_38;
    } while (uVar9 < node->mNumMeshes);
  }
  this_00 = local_48;
  if (node->mNumChildren != 0) {
    uVar10 = 0;
    do {
      BuildWCSMeshes(this_00,out,in,numIn,node->mChildren[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar10 < node->mNumChildren);
  }
  return;
}

Assistant:

void PretransformVertices::BuildWCSMeshes(std::vector<aiMesh *> &out, aiMesh **in,
		unsigned int numIn, aiNode *node) const {
	// NOTE:
	//  aiMesh::mNumBones store original source mesh, or UINT_MAX if not a copy
	//  aiMesh::mBones store reference to abs. transform we multiplied with

	// process meshes
	for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
		aiMesh *mesh = in[node->mMeshes[i]];

		// check whether we can operate on this mesh
		if (!mesh->mBones || *reinterpret_cast<aiMatrix4x4 *>(mesh->mBones) == node->mTransformation) {
			// yes, we can.
			mesh->mBones = reinterpret_cast<aiBone **>(&node->mTransformation);
			mesh->mNumBones = UINT_MAX;
		} else {

			// try to find us in the list of newly created meshes
			for (unsigned int n = 0; n < out.size(); ++n) {
				aiMesh *ctz = out[n];
				if (ctz->mNumBones == node->mMeshes[i] && *reinterpret_cast<aiMatrix4x4 *>(ctz->mBones) == node->mTransformation) {

					// ok, use this one. Update node mesh index
					node->mMeshes[i] = numIn + n;
				}
			}
			if (node->mMeshes[i] < numIn) {
				// Worst case. Need to operate on a full copy of the mesh
				ASSIMP_LOG_INFO("PretransformVertices: Copying mesh due to mismatching transforms");
				aiMesh *ntz;

				const unsigned int tmp = mesh->mNumBones; //
				mesh->mNumBones = 0;
				SceneCombiner::Copy(&ntz, mesh);
				mesh->mNumBones = tmp;

				ntz->mNumBones = node->mMeshes[i];
				ntz->mBones = reinterpret_cast<aiBone **>(&node->mTransformation);

				out.push_back(ntz);

				node->mMeshes[i] = static_cast<unsigned int>(numIn + out.size() - 1);
			}
		}
	}

	// call children
	for (unsigned int i = 0; i < node->mNumChildren; ++i)
		BuildWCSMeshes(out, in, numIn, node->mChildren[i]);
}